

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

Expression *
slang::ast::Expression::bindName
          (Compilation *comp,NameSyntax *syntax,InvocationExpressionSyntax *invocation,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  ulong uVar1;
  bitmask<slang::ast::LookupFlags> flags;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  underlying_type uVar6;
  Expression *pEVar7;
  RandomizeDetails *pRVar8;
  int iVar9;
  Compilation *pCVar10;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange SVar11;
  SourceRange SVar12;
  LookupResult result;
  ASTContext *in_stack_fffffffffffffd10;
  ASTContext *in_stack_fffffffffffffd18;
  InvalidExpression *local_2d8;
  undefined1 local_2a8 [32];
  size_type local_288;
  size_type local_280;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  local_278 [4];
  Element *local_1b8;
  BumpAllocator *local_1b0;
  FreeNode *local_1a8;
  Element local_1a0 [2];
  SmallVectorBase<slang::Diagnostic> local_160;
  undefined1 local_68 [24];
  size_t sStack_50;
  size_t local_48;
  undefined1 local_40;
  undefined4 local_3f;
  undefined3 uStack_3b;
  undefined1 local_38;
  
  if (((invocation != (InvocationExpressionSyntax *)0x0) &&
      (invocation->arguments != (ArgumentListSyntax *)0x0)) ||
     (iVar5 = 0, ((comp->options).flags.m_bits & 4) != 0)) {
    iVar5 = 2;
  }
  uVar1 = (context->flags).m_bits;
  iVar9 = ((uint)uVar1 & 0x40) * 0x20;
  iVar2 = iVar9 + 0x4004;
  if ((uVar1 >> 0x2c & 1) == 0) {
    iVar2 = iVar9;
  }
  uVar6 = iVar2 + iVar5;
  pCVar10 = (Compilation *)context->firstTempVar;
  flags.m_bits = uVar6 + 0x1020;
  if ((int)(comp->options).languageVersion < 1) {
    flags.m_bits = uVar6;
  }
  if ((uVar1 >> 0x29 & 1) == 0) {
    flags.m_bits = uVar6;
  }
  pRVar8 = context->randomizeDetails;
  if (((pCVar10 == (Compilation *)0x0) && (pRVar8 == (RandomizeDetails *)0x0)) &&
     (context->assertionInstance == (AssertionInstanceDetails *)0x0)) goto LAB_002c322d;
  if (pCVar10 != (Compilation *)0x0) {
    local_2a8._0_8_ = (Symbol *)0x0;
    local_2a8._8_5_ = 0;
    local_2a8._13_3_ = 0;
    local_2a8._16_5_ = 0;
    local_288 = 0;
    local_280 = 4;
    local_1b8 = local_1a0;
    local_1b0 = (BumpAllocator *)0x0;
    local_1a8 = (FreeNode *)0x2;
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    local_2a8._24_8_ = local_278;
    bVar3 = Lookup::findTempVar((context->scope).ptr,(TempVarSymbol *)pCVar10,syntax,
                                (LookupResult *)local_2a8);
    if (bVar3) {
      LookupResult::reportDiags((LookupResult *)local_2a8,context);
      SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pCVar10 = (Compilation *)local_2a8;
      SVar11.endLoc = (SourceLocation)invocation;
      SVar11.startLoc = SVar12.endLoc;
      local_2d8 = (InvalidExpression *)
                  bindLookupResult((Expression *)comp,pCVar10,(LookupResult *)SVar12.startLoc,SVar11
                                   ,(InvocationExpressionSyntax *)withClause,
                                   (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                   in_stack_fffffffffffffd10);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)pCVar10);
    if (local_1b8 != local_1a0) {
      operator_delete(local_1b8);
    }
    if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
         *)local_2a8._24_8_ != local_278) {
      operator_delete((void *)local_2a8._24_8_);
    }
    if (bVar3) {
      return &local_2d8->super_Expression;
    }
    pRVar8 = context->randomizeDetails;
  }
  if ((pRVar8 != (RandomizeDetails *)0x0) && (pRVar8->classType != (Scope *)0x0)) {
    local_2a8._24_8_ = local_278;
    local_2a8._0_8_ = (Symbol *)0x0;
    local_2a8._8_5_ = 0;
    local_2a8._13_3_ = 0;
    local_2a8._16_5_ = 0;
    local_288 = 0;
    local_280 = 4;
    local_1b8 = local_1a0;
    local_1b0 = (BumpAllocator *)0x0;
    local_1a8 = (FreeNode *)0x2;
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    pCVar10 = (Compilation *)syntax;
    bVar3 = Lookup::withinClassRandomize(context,syntax,flags,(LookupResult *)local_2a8);
    if (bVar3) {
      LookupResult::reportDiags((LookupResult *)local_2a8,context);
      SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pCVar10 = (Compilation *)local_2a8;
      SVar12.endLoc = (SourceLocation)invocation;
      SVar12.startLoc = SVar11.endLoc;
      local_2d8 = (InvalidExpression *)
                  bindLookupResult((Expression *)comp,pCVar10,(LookupResult *)SVar11.startLoc,SVar12
                                   ,(InvocationExpressionSyntax *)withClause,
                                   (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                   in_stack_fffffffffffffd10);
LAB_002c35af:
      bVar3 = false;
    }
    else {
      bVar4 = LookupResult::hasError((LookupResult *)local_2a8);
      bVar3 = true;
      if (bVar4) {
        LookupResult::reportDiags((LookupResult *)local_2a8,context);
        pCVar10 = (Compilation *)local_68;
        local_68._0_8_ = (Segment *)0x0;
        local_2d8 = BumpAllocator::
                    emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                              (&comp->super_BumpAllocator,(Expression **)pCVar10,comp->errorType);
        goto LAB_002c35af;
      }
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)pCVar10);
    if (local_1b8 != local_1a0) {
      operator_delete(local_1b8);
    }
    if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
         *)local_2a8._24_8_ != local_278) {
      operator_delete((void *)local_2a8._24_8_);
    }
    if (!bVar3) {
      return &local_2d8->super_Expression;
    }
  }
  if (context->assertionInstance != (AssertionInstanceDetails *)0x0) {
    local_2a8._24_8_ = local_278;
    local_2a8._0_8_ = (Symbol *)0x0;
    local_2a8._8_5_ = 0;
    local_2a8._13_3_ = 0;
    local_2a8._16_5_ = 0;
    local_288 = 0;
    local_280 = 4;
    local_1b8 = local_1a0;
    local_1b0 = (BumpAllocator *)0x0;
    local_1a8 = (FreeNode *)0x2;
    local_160.data_ = (pointer)local_160.firstElement;
    local_160.len = 0;
    local_160.cap = 2;
    pCVar10 = (Compilation *)syntax;
    bVar3 = Lookup::findAssertionLocalVar(context,syntax,(LookupResult *)local_2a8);
    if (bVar3) {
      LookupResult::reportDiags((LookupResult *)local_2a8,context);
      SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pCVar10 = (Compilation *)local_2a8;
      sourceRange_00.endLoc = (SourceLocation)invocation;
      sourceRange_00.startLoc = SVar11.endLoc;
      local_2d8 = (InvalidExpression *)
                  bindLookupResult((Expression *)comp,pCVar10,(LookupResult *)SVar11.startLoc,
                                   sourceRange_00,(InvocationExpressionSyntax *)withClause,
                                   (ArrayOrRandomizeMethodExpressionSyntax *)context,
                                   in_stack_fffffffffffffd10);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)pCVar10);
    if (local_1b8 != local_1a0) {
      operator_delete(local_1b8);
    }
    if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
         *)local_2a8._24_8_ != local_278) {
      operator_delete((void *)local_2a8._24_8_);
    }
    if (bVar3) {
      return &local_2d8->super_Expression;
    }
  }
LAB_002c322d:
  local_2a8._0_8_ = (Symbol *)0x0;
  local_2a8._8_5_ = 0;
  local_2a8._13_3_ = 0;
  local_2a8._16_5_ = 0;
  local_288 = 0;
  local_280 = 4;
  local_1b0 = (BumpAllocator *)0x0;
  local_1a8 = (FreeNode *)0x2;
  local_160.data_ = (pointer)local_160.firstElement;
  local_160.len = 0;
  local_160.cap = 2;
  local_2a8._24_8_ = local_278;
  local_1b8 = local_1a0;
  Lookup::name(syntax,context,flags,(LookupResult *)local_2a8);
  LookupResult::reportDiags((LookupResult *)local_2a8,context);
  if (CONCAT35(local_2a8._13_3_,local_2a8._8_5_) == 0) {
    SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pCVar10 = (Compilation *)local_2a8;
    sourceRange.endLoc = (SourceLocation)invocation;
    sourceRange.startLoc = SVar11.endLoc;
    pEVar7 = bindLookupResult((Expression *)comp,pCVar10,(LookupResult *)SVar11.startLoc,sourceRange
                              ,(InvocationExpressionSyntax *)withClause,
                              (ArrayOrRandomizeMethodExpressionSyntax *)context,
                              in_stack_fffffffffffffd10);
  }
  else {
    if (invocation != (InvocationExpressionSyntax *)0x0) {
      syntax = (NameSyntax *)invocation;
    }
    SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    local_68._0_8_ = CONCAT35(local_2a8._13_3_,local_2a8._8_5_);
    local_68._8_8_ = (context->scope).ptr;
    pCVar10 = (Compilation *)local_68;
    local_68._16_8_ = (value_type_pointer)0x0;
    sStack_50 = 0;
    local_48 = 0;
    local_3f = 0;
    uStack_3b = 0;
    local_40 = 0;
    local_38 = 1;
    pEVar7 = CallExpression::fromLookup
                       ((CallExpression *)comp,pCVar10,(Subroutine *)0x0,(Expression *)invocation,
                        (InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,SVar11,
                        in_stack_fffffffffffffd18);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup(&local_160,(EVP_PKEY_CTX *)pCVar10);
  if (local_1b8 != local_1a0) {
    operator_delete(local_1b8);
  }
  if ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
       *)local_2a8._24_8_ != local_278) {
    operator_delete((void *)local_2a8._24_8_);
  }
  return pEVar7;
}

Assistant:

Expression& Expression::bindName(Compilation& comp, const NameSyntax& syntax,
                                 const InvocationExpressionSyntax* invocation,
                                 const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                 const ASTContext& context) {
    bitmask<LookupFlags> flags = LookupFlags::None;
    if ((invocation && invocation->arguments) ||
        comp.hasFlag(CompilationFlags::AllowUseBeforeDeclare)) {
        flags |= LookupFlags::AllowDeclaredAfter;
    }

    if (context.flags.has(ASTFlags::StaticInitializer))
        flags |= LookupFlags::StaticInitializer;

    if (context.flags.has(ASTFlags::BindInstantiation))
        flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

    if (context.flags.has(ASTFlags::TypeOperator) &&
        comp.languageVersion() >= LanguageVersion::v1800_2023) {
        // v1800-2023: Type operator expressions are allowed to reference
        // incomplete forward class types now.
        flags |= LookupFlags::AllowIncompleteForwardTypedefs | LookupFlags::TypeReference;
    }

    // Special case scenarios: temporary variables, class-scoped randomize calls,
    // and expanding sequences and properties.
    if (context.firstTempVar || context.randomizeDetails || context.assertionInstance) {
        // If we have any temporary variables, they need to be findable even though they aren't
        // added to any scope. Check for that case and manually look for its name here.
        if (context.firstTempVar) {
            LookupResult result;
            if (Lookup::findTempVar(*context.scope, *context.firstTempVar, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }

        if (context.randomizeDetails && context.randomizeDetails->classType) {
            // Inside a class-scoped randomize call, first do a lookup in the class scope.
            // If it's not found, we proceed to do a normal lookup.
            LookupResult result;
            if (Lookup::withinClassRandomize(context, syntax, flags, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
            else if (result.hasError()) {
                result.reportDiags(context);
                return badExpr(comp, nullptr);
            }
        }

        if (context.assertionInstance) {
            // Look for a matching local assertion variable.
            LookupResult result;
            if (Lookup::findAssertionLocalVar(context, syntax, result)) {
                result.reportDiags(context);
                return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause,
                                        context);
            }
        }
    }

    // Normal name lookup and resolution.
    LookupResult result;
    Lookup::name(syntax, context, flags, result);
    result.reportDiags(context);

    if (result.systemSubroutine) {
        // There won't be any selectors here; this gets checked in the lookup call.
        SLANG_ASSERT(result.selectors.empty());

        SourceRange callRange = invocation ? invocation->sourceRange() : syntax.sourceRange();
        CallExpression::SystemCallInfo callInfo{result.systemSubroutine, context.scope, {}};
        return CallExpression::fromLookup(comp, callInfo, nullptr, invocation, withClause,
                                          callRange, context);
    }

    return bindLookupResult(comp, result, syntax.sourceRange(), invocation, withClause, context);
}